

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

string * format(string *__return_storage_ptr__,string *fmt,string *arg1,double arg2)

{
  allocator<char> local_9a;
  allocator<char> local_99;
  double local_98;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  local_98 = arg2;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"{1}",(allocator<char> *)&local_70);
  replace_positional(__return_storage_ptr__,&local_90,arg1);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"{2}",&local_99);
  format_abi_cxx11_(&local_30,local_98,6,3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50," ",&local_9a);
  trim(&local_70,&local_30,&local_50);
  replace_positional(__return_storage_ptr__,&local_90,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (
  const std::string& fmt,
  const std::string& arg1,
  double arg2)
{
  std::string output = fmt;
  replace_positional (output, "{1}", arg1);
  replace_positional (output, "{2}", trim (format (arg2, 6, 3)));
  return output;
}